

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nim.h
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall NimState::get_moves(NimState *this)

{
  int iVar1;
  int *piVar2;
  vector<int,_std::allocator<int>_> *in_RSI;
  vector<int,_std::allocator<int>_> *in_RDI;
  Move move;
  vector<int,_std::allocator<int>_> *moves;
  NimState *in_stack_ffffffffffffffb0;
  int local_1c;
  int local_18;
  undefined1 local_11;
  
  check_invariant(in_stack_ffffffffffffffb0);
  local_11 = 0;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x126789);
  local_18 = 1;
  while( true ) {
    iVar1 = local_18;
    local_1c = 3;
    piVar2 = std::min<int>(&local_1c,
                           (int *)((long)&(in_RSI->super__Vector_base<int,_std::allocator<int>_>).
                                          _M_impl.super__Vector_impl_data._M_start + 4));
    if (*piVar2 < iVar1) break;
    std::vector<int,_std::allocator<int>_>::push_back(in_RSI,(value_type *)in_RDI);
    local_18 = local_18 + 1;
  }
  return in_RDI;
}

Assistant:

std::vector<Move> get_moves() const
	{
		check_invariant();

		std::vector<Move> moves;
		for (Move move = 1; move <= std::min(3, chips); ++move) {
			moves.push_back(move);
		}
		return moves;
	}